

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionSystemBullet.cpp
# Opt level: O2

bool __thiscall
chrono::collision::ChCollisionSystemBullet::RayHit
          (ChCollisionSystemBullet *this,ChVector<double> *from,ChVector<double> *to,
          ChRayhitResult *result,short filter_group,short filter_mask)

{
  double dVar1;
  ChCollisionModel *pCVar2;
  undefined1 auVar3 [32];
  undefined2 in_register_00000082;
  undefined2 in_register_0000008a;
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined **local_78;
  float local_70;
  long local_68;
  undefined4 local_60;
  undefined4 local_5c;
  undefined4 local_58;
  undefined8 local_54;
  ulong uStack_4c;
  undefined8 local_44;
  ulong uStack_3c;
  ulong local_30;
  
  local_5c = CONCAT22(in_register_0000008a,filter_mask);
  local_60 = CONCAT22(in_register_00000082,filter_group);
  auVar4 = vcvtpd2ps_avx(*(undefined1 (*) [16])from->m_data);
  local_54 = vmovlps_avx(auVar4);
  auVar4 = vcvtpd2ps_avx(*(undefined1 (*) [16])to->m_data);
  uStack_4c = (ulong)(uint)(float)from->m_data[2];
  local_70 = 1.0;
  local_68 = 0;
  local_58 = 0;
  local_78 = &PTR__RayResultCallback_01188cb0;
  local_44 = vmovlps_avx(auVar4);
  uStack_3c = (ulong)(uint)(float)to->m_data[2];
  (*this->bt_collision_world->_vptr_cbtCollisionWorld[8])();
  if (local_68 != 0) {
    pCVar2 = *(ChCollisionModel **)(local_68 + 0x118);
    result->hitModel = pCVar2;
    if (pCVar2 != (ChCollisionModel *)0x0) {
      result->hit = true;
      auVar4 = vgatherdps_avx512vl(*(undefined4 *)((long)&local_78 + (long)pCVar2));
      auVar3 = vcvtps2pd_avx(auVar4);
      result->abs_hitPoint = (ChVector<double>)auVar3._0_24_;
      (result->abs_hitNormal).m_data[0] = (double)auVar3._24_8_;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_30;
      auVar4 = vcvtps2pd_avx(auVar4);
      *(undefined1 (*) [16])((result->abs_hitNormal).m_data + 1) = auVar4;
      ChVector<double>::Normalize(&result->abs_hitNormal);
      dVar5 = (double)local_70;
      result->dist_factor = dVar5;
      (*result->hitModel->_vptr_ChCollisionModel[0x25])();
      dVar6 = (double)SUB84(dVar5,0);
      dVar5 = (result->abs_hitNormal).m_data[2];
      dVar1 = (result->abs_hitPoint).m_data[2];
      auVar7._0_8_ = dVar6 * (result->abs_hitNormal).m_data[0];
      auVar7._8_8_ = dVar6 * (result->abs_hitNormal).m_data[1];
      auVar4 = vsubpd_avx(*(undefined1 (*) [16])(result->abs_hitPoint).m_data,auVar7);
      *(undefined1 (*) [16])(result->abs_hitPoint).m_data = auVar4;
      (result->abs_hitPoint).m_data[2] = dVar1 - dVar6 * dVar5;
      return true;
    }
  }
  result->hit = false;
  return false;
}

Assistant:

bool ChCollisionSystemBullet::RayHit(const ChVector<>& from,
                                     const ChVector<>& to,
                                     ChRayhitResult& result,
                                     short int filter_group,
                                     short int filter_mask) const {
    cbtVector3 btfrom((cbtScalar)from.x(), (cbtScalar)from.y(), (cbtScalar)from.z());
    cbtVector3 btto((cbtScalar)to.x(), (cbtScalar)to.y(), (cbtScalar)to.z());

    cbtCollisionWorld::ClosestRayResultCallback rayCallback(btfrom, btto);
    rayCallback.m_collisionFilterGroup = filter_group;
    rayCallback.m_collisionFilterMask = filter_mask;

    this->bt_collision_world->rayTest(btfrom, btto, rayCallback);

    if (rayCallback.hasHit()) {
        result.hitModel = (ChCollisionModel*)(rayCallback.m_collisionObject->getUserPointer());
        if (result.hitModel) {
            result.hit = true;
            result.abs_hitPoint.Set(rayCallback.m_hitPointWorld.x(), rayCallback.m_hitPointWorld.y(),
                                    rayCallback.m_hitPointWorld.z());
            result.abs_hitNormal.Set(rayCallback.m_hitNormalWorld.x(), rayCallback.m_hitNormalWorld.y(),
                                     rayCallback.m_hitNormalWorld.z());
            result.abs_hitNormal.Normalize();
            result.dist_factor = rayCallback.m_closestHitFraction;
            result.abs_hitPoint = result.abs_hitPoint - result.abs_hitNormal * result.hitModel->GetEnvelope();
            return true;
        }
    }
    result.hit = false;
    return false;
}